

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tinyfiledialogs.c
# Opt level: O0

void Hex2RGB(char *aHexRGB,uchar *aoResultRGB)

{
  ulong uVar1;
  undefined1 *in_RSI;
  char *in_RDI;
  char lColorChannel [8];
  char cStack_18;
  char acStack_17 [2];
  char local_15 [2];
  char local_13 [3];
  undefined1 *local_10;
  
  if (in_RSI != (undefined1 *)0x0) {
    if (in_RDI == (char *)0x0) {
      *in_RSI = 0;
      in_RSI[1] = 0;
      in_RSI[2] = 0;
    }
    else {
      local_10 = in_RSI;
      strcpy(&cStack_18,in_RDI);
      uVar1 = strtoul(local_13,(char **)0x0,0x10);
      local_10[2] = (char)uVar1;
      local_13[0] = '\0';
      uVar1 = strtoul(local_15,(char **)0x0,0x10);
      local_10[1] = (char)uVar1;
      local_15[0] = '\0';
      uVar1 = strtoul(acStack_17,(char **)0x0,0x10);
      *local_10 = (char)uVar1;
    }
  }
  return;
}

Assistant:

static void Hex2RGB( char const aHexRGB[8] , unsigned char aoResultRGB[3] )
{
        char lColorChannel[8] ;
        if ( aoResultRGB )
        {
                if ( aHexRGB )
                {
                        strcpy(lColorChannel, aHexRGB ) ;
                        aoResultRGB[2] = (unsigned char)strtoul(lColorChannel+5,NULL,16);
                        lColorChannel[5] = '\0';
                        aoResultRGB[1] = (unsigned char)strtoul(lColorChannel+3,NULL,16);
                        lColorChannel[3] = '\0';
                        aoResultRGB[0] = (unsigned char)strtoul(lColorChannel+1,NULL,16);
/* printf("%d %d %d\n", aoResultRGB[0], aoResultRGB[1], aoResultRGB[2]); */
                }
                else
                {
                        aoResultRGB[0]=0;
                        aoResultRGB[1]=0;
                        aoResultRGB[2]=0;
                }
        }
}